

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.cpp
# Opt level: O2

bool __thiscall
YAML::EmitterState::SetFlowType(EmitterState *this,value groupType,EMITTER_MANIP value,value scope)

{
  if ((value & ~TagByKind) == Flow) {
    _Set<YAML::EMITTER_MANIP>(this,&this->m_seqFmt + (groupType != Seq),value,scope);
  }
  return (value & ~TagByKind) == Flow;
}

Assistant:

bool EmitterState::SetFlowType(GroupType::value groupType, EMITTER_MANIP value,
                               FmtScope::value scope) {
  switch (value) {
    case Block:
    case Flow:
      _Set(groupType == GroupType::Seq ? m_seqFmt : m_mapFmt, value, scope);
      return true;
    default:
      return false;
  }
}